

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndDragDropSource(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->DragDropActive != false) {
    if ((GImGui->DragDropSourceFlags & 1) == 0) {
      EndTooltip();
      PopStyleColor(1);
    }
    pIVar1 = GImGui;
    if ((pIVar2->DragDropPayload).DataFrameCount == -1) {
      GImGui->DragDropActive = false;
      (pIVar1->DragDropPayload).DataType[0] = '\0';
      (pIVar1->DragDropPayload).DataType[1] = '\0';
      (pIVar1->DragDropPayload).DataType[2] = '\0';
      (pIVar1->DragDropPayload).DataType[3] = '\0';
      (pIVar1->DragDropPayload).DataType[4] = '\0';
      (pIVar1->DragDropPayload).DataType[5] = '\0';
      (pIVar1->DragDropPayload).DataType[6] = '\0';
      (pIVar1->DragDropPayload).DataType[7] = '\0';
      (pIVar1->DragDropPayload).DataType[8] = '\0';
      (pIVar1->DragDropPayload).DataType[9] = '\0';
      (pIVar1->DragDropPayload).DataType[10] = '\0';
      (pIVar1->DragDropPayload).DataType[0xb] = '\0';
      (pIVar1->DragDropPayload).DataType[0xc] = '\0';
      (pIVar1->DragDropPayload).DataType[0xd] = '\0';
      (pIVar1->DragDropPayload).DataType[0xe] = '\0';
      (pIVar1->DragDropPayload).DataType[0xf] = '\0';
      (pIVar1->DragDropPayload).DataType[0x10] = '\0';
      (pIVar1->DragDropPayload).DataType[0x11] = '\0';
      (pIVar1->DragDropPayload).DataType[0x12] = '\0';
      (pIVar1->DragDropPayload).DataType[0x13] = '\0';
      (pIVar1->DragDropPayload).DataType[0x14] = '\0';
      (pIVar1->DragDropPayload).DataType[0x15] = '\0';
      (pIVar1->DragDropPayload).DataType[0x16] = '\0';
      (pIVar1->DragDropPayload).DataType[0x17] = '\0';
      (pIVar1->DragDropPayload).DataType[0x18] = '\0';
      (pIVar1->DragDropPayload).DataType[0x19] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1a] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1b] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1c] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1d] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1e] = '\0';
      (pIVar1->DragDropPayload).DataType[0x1f] = '\0';
      (pIVar1->DragDropPayload).DataType[0x20] = '\0';
      (pIVar1->DragDropPayload).Data = (void *)0x0;
      (pIVar1->DragDropPayload).DataSize = 0;
      (pIVar1->DragDropPayload).SourceId = 0;
      (pIVar1->DragDropPayload).SourceParentId = 0;
      (pIVar1->DragDropPayload).DataFrameCount = -1;
      (pIVar1->DragDropPayload).Preview = false;
      (pIVar1->DragDropPayload).Delivery = false;
      pIVar1->DragDropAcceptIdPrev = 0;
      pIVar1->DragDropAcceptFrameCount = -1;
      pIVar1->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      pIVar1->DragDropAcceptIdCurr = 0;
    }
    return;
  }
  __assert_fail("g.DragDropActive",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x33aa,"void ImGui::EndDragDropSource()");
}

Assistant:

void ImGui::EndDragDropSource()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);

    if (!(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        EndTooltip();
        PopStyleColor();
        //PopStyleVar();
    }

    // Discard the drag if have not called SetDragDropPayload()
    if (g.DragDropPayload.DataFrameCount == -1)
        ClearDragDrop();
}